

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemdelegate.cpp
# Opt level: O3

QItemDelegate * __thiscall
QItemDelegate::decoration(QItemDelegate *this,QStyleOptionViewItem *option,QVariant *variant)

{
  undefined8 uVar1;
  undefined8 uVar2;
  QMetaType QVar3;
  QMetaType QVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  QMetaType QVar8;
  undefined1 *in_RCX;
  long in_FS_OFFSET;
  double dVar9;
  QIcon t;
  QIcon local_50;
  QMetaType local_48;
  undefined4 uStack_40;
  undefined2 uStack_3c;
  undefined2 uStack_3a;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = ::QVariant::typeId((QVariant *)in_RCX);
  if (iVar6 == 0x1003) {
    if (decoration(QStyleOptionViewItem_const&,QVariant_const&)::pixmap == '\0') {
      decoration();
    }
    local_50.d = (QIconPrivate *)&QtPrivate::QMetaTypeInterfaceWrapper<QColor>::metaType;
    uVar7 = *(ulong *)((QPixmap *)in_RCX + 0x18) & 0xfffffffffffffffc;
    local_48.d_ptr._0_4_ = (undefined4)uVar7;
    local_48.d_ptr._4_2_ = (undefined2)(uVar7 >> 0x20);
    local_48.d_ptr._6_2_ = (undefined2)(uVar7 >> 0x30);
    bVar5 = comparesEqual(&local_48,(QMetaType *)&local_50);
    if (bVar5) {
      if (((byte)((QPixmap *)in_RCX)[0x18] & 1) != 0) {
        in_RCX = (undefined1 *)((long)*(int *)(*(long *)in_RCX + 4) + *(long *)in_RCX);
      }
      uVar1 = *(undefined8 *)in_RCX;
      uVar2 = *(undefined8 *)((QPixmap *)in_RCX + 8);
      local_48.d_ptr._0_4_ = (undefined4)uVar1;
      local_48.d_ptr._4_2_ = (undefined2)((ulong)uVar1 >> 0x20);
      local_48.d_ptr._6_2_ = (undefined2)((ulong)uVar1 >> 0x30);
      uStack_40 = (undefined4)uVar2;
      uStack_3c = (undefined2)((ulong)uVar2 >> 0x20);
      uStack_3a = (undefined2)((ulong)uVar2 >> 0x30);
    }
    else {
      uStack_3a = 0xaaaa;
      local_48.d_ptr._0_4_ = 0;
      local_48.d_ptr._4_2_ = 0xffff;
      local_48.d_ptr._6_2_ = 0;
      uStack_40 = 0;
      uStack_3c = 0;
      QVar8.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if (((byte)((QPixmap *)in_RCX)[0x18] & 1) != 0) {
        in_RCX = (undefined1 *)((long)*(int *)(*(long *)in_RCX + 4) + *(long *)in_RCX);
      }
      QMetaType::convert(QVar8,in_RCX,(QMetaType)local_50.d,&local_48);
    }
    in_RCX = decoration(QStyleOptionViewItem_const&,QVariant_const&)::pixmap;
    QPixmap::fill((QColor *)decoration(QStyleOptionViewItem_const&,QVariant_const&)::pixmap);
  }
  else {
    if (iVar6 == 0x1005) {
      if (*(long *)&variant[3].d.field_0x18 == 0) {
        dVar9 = (double)QGuiApplication::devicePixelRatio();
      }
      else {
        dVar9 = (double)QPaintDevice::devicePixelRatio();
      }
      local_48.d_ptr._0_4_ = 0x7e7fd0;
      local_48.d_ptr._4_2_ = 0;
      local_48.d_ptr._6_2_ = 0;
      local_50.d = (QIconPrivate *)(*(ulong *)((QPixmap *)in_RCX + 0x18) & 0xfffffffffffffffc);
      bVar5 = comparesEqual((QMetaType *)&local_50,&local_48);
      if (bVar5) {
        if (((byte)((QPixmap *)in_RCX)[0x18] & 1) != 0) {
          in_RCX = (undefined1 *)((long)*(int *)(*(long *)in_RCX + 4) + *(long *)in_RCX);
        }
        QIcon::QIcon(&local_50,(QIcon *)in_RCX);
      }
      else {
        local_50.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
        QIcon::QIcon(&local_50);
        QVar8.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
        if (((byte)((QPixmap *)in_RCX)[0x18] & 1) != 0) {
          in_RCX = (undefined1 *)((long)*(int *)(*(long *)in_RCX + 4) + *(long *)in_RCX);
        }
        QVar4.d_ptr._4_2_ = local_48.d_ptr._4_2_;
        QVar4.d_ptr._0_4_ = local_48.d_ptr._0_4_;
        QVar4.d_ptr._6_2_ = local_48.d_ptr._6_2_;
        QMetaType::convert(QVar8,in_RCX,QVar4,&local_50);
      }
      QIcon::pixmap((QSize *)this,dVar9,(Mode)&local_50,(int)variant + 0x50);
      QIcon::~QIcon(&local_50);
      goto LAB_00557f61;
    }
    local_48.d_ptr._0_4_ = 0x7e8040;
    local_48.d_ptr._4_2_ = 0;
    local_48.d_ptr._6_2_ = 0;
    local_50.d = (QIconPrivate *)(*(ulong *)((QPixmap *)in_RCX + 0x18) & 0xfffffffffffffffc);
    bVar5 = comparesEqual((QMetaType *)&local_50,&local_48);
    if (!bVar5) {
      *(undefined1 **)&this[1].super_QAbstractItemDelegate = &DAT_aaaaaaaaaaaaaaaa;
      *(undefined1 **)&this->super_QAbstractItemDelegate = &DAT_aaaaaaaaaaaaaaaa;
      *(undefined1 **)&(this->super_QAbstractItemDelegate).field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
      QPixmap::QPixmap((QPixmap *)this);
      QVar8.d_ptr = (QMetaTypeInterface *)::QVariant::metaType();
      if (((byte)((QPixmap *)in_RCX)[0x18] & 1) != 0) {
        in_RCX = (undefined1 *)((long)*(int *)(*(long *)in_RCX + 4) + *(long *)in_RCX);
      }
      QVar3.d_ptr._4_2_ = local_48.d_ptr._4_2_;
      QVar3.d_ptr._0_4_ = local_48.d_ptr._0_4_;
      QVar3.d_ptr._6_2_ = local_48.d_ptr._6_2_;
      QMetaType::convert(QVar8,in_RCX,QVar3,this);
      goto LAB_00557f61;
    }
    if (((byte)((QPixmap *)in_RCX)[0x18] & 1) != 0) {
      in_RCX = (undefined1 *)((long)*(int *)(*(long *)in_RCX + 4) + *(long *)in_RCX);
    }
  }
  QPixmap::QPixmap((QPixmap *)this,(QPixmap *)in_RCX);
LAB_00557f61:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QPixmap QItemDelegate::decoration(const QStyleOptionViewItem &option, const QVariant &variant) const
{
    Q_D(const QItemDelegate);
    switch (variant.userType()) {
    case QMetaType::QIcon: {
        QIcon::Mode mode = d->iconMode(option.state);
        QIcon::State state = d->iconState(option.state);
        const auto dpr = QStyleHelper::getDpr(option.widget);
        return qvariant_cast<QIcon>(variant).pixmap(option.decorationSize, dpr, mode, state); }
    case QMetaType::QColor: {
        static QPixmap pixmap(option.decorationSize);
        pixmap.fill(qvariant_cast<QColor>(variant));
        return pixmap; }
    default:
        break;
    }

    return qvariant_cast<QPixmap>(variant);
}